

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O0

void ncnn::im2col_sgemm_pack8to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  Option *in_stack_000011b8;
  Mat *in_stack_000011c0;
  Mat *in_stack_000011c8;
  Mat *in_stack_000011d0;
  
  im2col_sgemm_pack8to4_int8_sse
            (in_stack_000011d0,in_stack_000011c8,in_stack_000011c0,in_stack_000011b8);
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}